

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

nghttp2_nv * nghttp2_hd_table_get2(nghttp2_hd_context *context,size_t idx)

{
  nghttp2_hd_entry *pnVar1;
  size_t idx_local;
  nghttp2_hd_context *context_local;
  
  if (idx < (context->hd_table).len + 0x3d) {
    if (idx < 0x3d) {
      context_local = (nghttp2_hd_context *)&static_table[idx].cnv;
    }
    else {
      pnVar1 = hd_ringbuf_get(&context->hd_table,idx - 0x3d);
      context_local = (nghttp2_hd_context *)&pnVar1->cnv;
    }
    return (nghttp2_nv *)context_local;
  }
  __assert_fail("INDEX_RANGE_VALID(context, idx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                ,0x525,"const nghttp2_nv *nghttp2_hd_table_get2(nghttp2_hd_context *, size_t)");
}

Assistant:

static const nghttp2_nv *nghttp2_hd_table_get2(nghttp2_hd_context *context,
                                               size_t idx) {
  assert(INDEX_RANGE_VALID(context, idx));
  if (idx >= NGHTTP2_STATIC_TABLE_LENGTH) {
    return &hd_ringbuf_get(&context->hd_table,
                           idx - NGHTTP2_STATIC_TABLE_LENGTH)
                ->cnv;
  }

  return &static_table[idx].cnv;
}